

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli.c
# Opt level: O0

int WriteOutput(Context *context)

{
  FILE *__stream;
  int iVar1;
  size_t __n;
  char *pcVar2;
  int *piVar3;
  char *pcVar4;
  size_t out_size;
  Context *context_local;
  
  __n = (long)context->next_out - (long)context->output;
  context->total_out = __n + context->total_out;
  if (__n == 0) {
    context_local._4_4_ = 1;
  }
  else if (context->test_integrity == 0) {
    fwrite(context->output,1,__n,(FILE *)context->fout);
    iVar1 = ferror((FILE *)context->fout);
    __stream = _stderr;
    if (iVar1 == 0) {
      context_local._4_4_ = 1;
    }
    else {
      pcVar2 = PrintablePath(context->current_output_path);
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      fprintf(__stream,"failed to write output [%s]: %s\n",pcVar2,pcVar4);
      context_local._4_4_ = 0;
    }
  }
  else {
    context_local._4_4_ = 1;
  }
  return context_local._4_4_;
}

Assistant:

static BROTLI_BOOL WriteOutput(Context* context) {
  size_t out_size = (size_t)(context->next_out - context->output);
  context->total_out += out_size;
  if (out_size == 0) return BROTLI_TRUE;
  if (context->test_integrity) return BROTLI_TRUE;

  fwrite(context->output, 1, out_size, context->fout);
  if (ferror(context->fout)) {
    fprintf(stderr, "failed to write output [%s]: %s\n",
            PrintablePath(context->current_output_path), strerror(errno));
    return BROTLI_FALSE;
  }
  return BROTLI_TRUE;
}